

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::dtime_tz_t,duckdb::interval_t,duckdb::dtime_tz_t,duckdb::BinaryStandardOperatorWrapper,duckdb::SubtractTimeOperator,bool,true,false>
               (dtime_tz_t *ldata,interval_t *rdata,dtime_tz_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  dtime_tz_t left;
  dtime_tz_t left_00;
  dtime_tz_t dVar3;
  ulong uVar4;
  dtime_tz_t *pdVar5;
  dtime_tz_t *pdVar6;
  idx_t iVar7;
  ulong uVar8;
  idx_t iVar9;
  ulong uVar10;
  int64_t *piVar11;
  ulong uVar12;
  interval_t right;
  interval_t right_00;
  interval_t right_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    piVar11 = &rdata->micros;
    iVar7 = count;
    for (iVar9 = 0; count != iVar9; iVar9 = iVar9 + 1) {
      dVar3.bits._0_4_ = ((interval_t *)(piVar11 + -1))->months;
      dVar3.bits._4_4_ = ((interval_t *)(piVar11 + -1))->days;
      right_01.micros = iVar7;
      right_01._0_8_ = *piVar11;
      dVar3 = SubtractTimeOperator::
              Operation<duckdb::dtime_tz_t,duckdb::interval_t,duckdb::dtime_tz_t>
                        ((SubtractTimeOperator *)ldata->bits,dVar3,right_01);
      result_data[iVar9].bits = dVar3.bits;
      piVar11 = piVar11 + 2;
    }
  }
  else {
    uVar10 = 0;
    for (pdVar5 = (dtime_tz_t *)0x0; pdVar5 != (dtime_tz_t *)(count + 0x3f >> 6);
        pdVar5 = (dtime_tz_t *)((long)&pdVar5->bits + 1)) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar8 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar8 = count;
        }
LAB_0180ddd4:
        piVar11 = &rdata[uVar10].micros;
        pdVar6 = pdVar5;
        for (; uVar4 = uVar10, uVar10 < uVar8; uVar10 = uVar10 + 1) {
          left.bits._0_4_ = ((interval_t *)(piVar11 + -1))->months;
          left.bits._4_4_ = ((interval_t *)(piVar11 + -1))->days;
          right.micros = (int64_t)pdVar6;
          right._0_8_ = *piVar11;
          dVar3 = SubtractTimeOperator::
                  Operation<duckdb::dtime_tz_t,duckdb::interval_t,duckdb::dtime_tz_t>
                            ((SubtractTimeOperator *)ldata->bits,left,right);
          result_data[uVar10].bits = dVar3.bits;
          piVar11 = piVar11 + 2;
        }
      }
      else {
        uVar2 = puVar1[(long)pdVar5];
        uVar8 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar8 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_0180ddd4;
        uVar4 = uVar8;
        if (uVar2 != 0) {
          piVar11 = &rdata[uVar10].micros;
          pdVar6 = pdVar5;
          for (uVar12 = 0; uVar4 = uVar12 + uVar10, uVar12 + uVar10 < uVar8; uVar12 = uVar12 + 1) {
            if ((uVar2 >> (uVar12 & 0x3f) & 1) != 0) {
              left_00.bits._0_4_ = ((interval_t *)(piVar11 + -1))->months;
              left_00.bits._4_4_ = ((interval_t *)(piVar11 + -1))->days;
              right_00.micros = (int64_t)pdVar6;
              right_00._0_8_ = *piVar11;
              dVar3 = SubtractTimeOperator::
                      Operation<duckdb::dtime_tz_t,duckdb::interval_t,duckdb::dtime_tz_t>
                                ((SubtractTimeOperator *)ldata->bits,left_00,right_00);
              (result_data + uVar10)[uVar12].bits = dVar3.bits;
              pdVar6 = result_data + uVar10;
            }
            piVar11 = piVar11 + 2;
          }
        }
      }
      uVar10 = uVar4;
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}